

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O0

size_t __thiscall
flatbuffers::VerifierTemplate<false>::VerifyOffset<unsigned_int,int>
          (VerifierTemplate<false> *this,size_t start)

{
  bool bVar1;
  uint uVar2;
  uint o;
  size_t start_local;
  VerifierTemplate<false> *this_local;
  
  bVar1 = Verify<unsigned_int>(this,start);
  if (bVar1) {
    uVar2 = ReadScalar<unsigned_int>(this->buf_ + start);
    bVar1 = Check(this,uVar2 != 0);
    if (bVar1) {
      bVar1 = Check(this,-1 < (int)uVar2);
      if (bVar1) {
        bVar1 = Verify(this,start + uVar2,1);
        if (bVar1) {
          this_local = (VerifierTemplate<false> *)(ulong)uVar2;
        }
        else {
          this_local = (VerifierTemplate<false> *)0x0;
        }
      }
      else {
        this_local = (VerifierTemplate<false> *)0x0;
      }
    }
    else {
      this_local = (VerifierTemplate<false> *)0x0;
    }
  }
  else {
    this_local = (VerifierTemplate<false> *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t VerifyOffset(const size_t start) const {
    if (!Verify<OffsetT>(start)) return 0;
    const auto o = ReadScalar<OffsetT>(buf_ + start);
    // May not point to itself.
    if (!Check(o != 0)) return 0;
    // Can't wrap around larger than the max size.
    if (!Check(static_cast<SOffsetT>(o) >= 0)) return 0;
    // Must be inside the buffer to create a pointer from it (pointer outside
    // buffer is UB).
    if (!Verify(start + o, 1)) return 0;
    return o;
  }